

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

bool __thiscall
MotionTrajectory::AddConstantAccel(MotionTrajectory *this,double acc,double vEnd,bool isInfinite)

{
  double *pdVar1;
  pointer *pppMVar2;
  double dVar3;
  pointer ppMVar4;
  iterator __position;
  ConstantAccel *this_00;
  MotionBase *prevMotion;
  MotionBase *motion;
  ConstantAccel *local_38;
  double local_30;
  double local_28;
  
  ppMVar4 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar4 ==
      (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    prevMotion = (MotionBase *)0x0;
  }
  else {
    prevMotion = ppMVar4[-1];
  }
  local_30 = acc;
  local_28 = vEnd;
  this_00 = (ConstantAccel *)operator_new(0x50);
  ConstantAccel::ConstantAccel(this_00,local_30,local_28,isInfinite,prevMotion);
  dVar3 = (this_00->super_MotionBase).tf;
  pdVar1 = &(this_00->super_MotionBase).t0;
  local_38 = this_00;
  if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
    __position._M_current =
         (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<MotionBase*,std::allocator<MotionBase*>>::_M_realloc_insert<MotionBase*const&>
                ((vector<MotionBase*,std::allocator<MotionBase*>> *)this,__position,
                 (MotionBase **)&local_38);
    }
    else {
      *__position._M_current = (MotionBase *)this_00;
      pppMVar2 = &(this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar2 = *pppMVar2 + 1;
    }
  }
  return (bool)(-((local_38->super_MotionBase).t0 != (local_38->super_MotionBase).tf) & 1);
}

Assistant:

bool MotionTrajectory::AddConstantAccel(double acc, double vEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantAccel(acc, vEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}